

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_devices.cpp
# Opt level: O0

void __thiscall
cubeb_destroy_default_collection_Test::~cubeb_destroy_default_collection_Test
          (cubeb_destroy_default_collection_Test *this)

{
  void *in_RDI;
  
  ~cubeb_destroy_default_collection_Test((cubeb_destroy_default_collection_Test *)0x10e508);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(cubeb, destroy_default_collection)
{
  int r;
  cubeb * ctx = NULL;
  cubeb_device_collection collection{nullptr, 0};

  r = common_init(&ctx, "Cubeb audio test");
  ASSERT_EQ(r, CUBEB_OK) << "Error initializing cubeb library";

  std::unique_ptr<cubeb, decltype(&cubeb_destroy)> cleanup_cubeb_at_exit(
      ctx, cubeb_destroy);

  ASSERT_EQ(collection.device, nullptr);
  ASSERT_EQ(collection.count, (size_t)0);

  r = cubeb_device_collection_destroy(ctx, &collection);
  if (r != CUBEB_ERROR_NOT_SUPPORTED) {
    ASSERT_EQ(r, CUBEB_OK);
    ASSERT_EQ(collection.device, nullptr);
    ASSERT_EQ(collection.count, (size_t)0);
  }
}